

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_link_errors
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  char *pcVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  LayoutBindingProgram *pLVar6;
  String local_5d0;
  uint local_5ac;
  String local_5a8;
  LayoutBindingProgramAutoPtr local_588;
  LayoutBindingProgramAutoPtr program;
  string local_560 [32];
  string local_540 [32];
  String local_520;
  String local_500;
  allocator<char> local_4d9;
  string local_4d8 [32];
  string local_4b8 [32];
  String local_498;
  string local_478 [32];
  String local_458;
  allocator<char> local_431;
  String local_430;
  String local_410;
  allocator<char> local_3e9;
  String local_3e8;
  String local_3c8;
  String local_3a8;
  string local_388 [32];
  string local_368 [32];
  undefined1 local_348 [8];
  StringStream s;
  String local_1c8;
  String local_1a8;
  String local_188;
  allocator<char> local_161;
  string local_160 [32];
  string local_140 [32];
  String local_120;
  string local_100 [32];
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  String local_98;
  allocator<char> local_61;
  String local_60;
  undefined1 local_40 [8];
  String decl;
  bool passed;
  LayoutBindingBaseCase *this_local;
  
  decl.field_2._M_local_buf[0xf] = '\x01';
  bVar3 = isStage(this,VertexShader);
  if (bVar3) {
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar1 = *(char **)CONCAT44(extraout_var,iVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])(&local_98,this,1);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar1 = *(char **)(CONCAT44(extraout_var_00,iVar4) + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar1,&local_b9);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_100,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_e0,this,local_100);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_140,this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_160,"float",&local_161);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_120,this,local_140,local_160);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_188,this,0);
    std::__cxx11::string::string((string *)&local_1a8);
    buildUniformDecl((String *)local_40,this,&local_60,&local_98,&local_b8,&local_e0,&local_120,
                     &local_188,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    setTemplateParam(this,VertexShader,"UNIFORM_DECL",(String *)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"fragColor =",
               (allocator<char> *)&s.super_ostringstream.field_0x177);
    setTemplateParam(this,VertexShader,"OUT_ASSIGNMENT",&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&s.super_ostringstream.field_0x177);
    StringStream::StringStream((StringStream *)local_348);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_388,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
              (local_368,this,local_388);
    poVar5 = std::operator<<((ostream *)local_348,local_368);
    std::operator<<(poVar5,";\n");
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::ostringstream::str();
    setTemplateParam(this,VertexShader,"UNIFORM_ACCESS",&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    updateTemplate(this,VertexShader);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar1 = *(char **)CONCAT44(extraout_var_01,iVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,pcVar1,&local_3e9);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])(&local_410,this,3);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar1 = *(char **)(CONCAT44(extraout_var_02,iVar4) + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,pcVar1,&local_431);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_478,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_458,this,local_478);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_4b8,this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4d8,"float",&local_4d9);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_498,this,local_4b8,local_4d8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_500,this,0);
    std::__cxx11::string::string((string *)&local_520);
    buildUniformDecl(&local_3c8,this,&local_3e8,&local_410,&local_430,&local_458,&local_498,
                     &local_500,&local_520);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::~string(local_4b8);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    setTemplateParam(this,FragmentShader,"UNIFORM_DECL",(String *)local_40);
    StringStream::reset((StringStream *)local_348);
    poVar5 = std::operator<<((ostream *)local_348,"fragColor + ");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_560,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
              (local_540,this,local_560);
    poVar5 = std::operator<<(poVar5,local_540);
    std::operator<<(poVar5,";\n");
    std::__cxx11::string::~string(local_540);
    std::__cxx11::string::~string(local_560);
    std::__cxx11::ostringstream::str();
    setTemplateParam(this,FragmentShader,"UNIFORM_ACCESS",(String *)&program);
    std::__cxx11::string::~string((string *)&program);
    updateTemplate(this,FragmentShader);
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
              (&local_588,&this->super_IProgramContextSupplier);
    pLVar6 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_588);
    bVar3 = LayoutBindingProgram::compiledAndLinked(pLVar6);
    decl.field_2._M_local_buf[0xf] = (bVar3 ^ 0xffU) & 1;
    bVar3 = decl.field_2._M_local_buf[0xf] == 0;
    if (bVar3) {
      pLVar6 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_588);
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_5a8,pLVar6,true);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,false,&local_5a8,false);
      std::__cxx11::string::~string((string *)&local_5a8);
    }
    local_5ac = (uint)bVar3;
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_588);
    StringStream::~StringStream((StringStream *)local_348);
    std::__cxx11::string::~string((string *)local_40);
    if (local_5ac != 0) {
      return __return_storage_ptr__;
    }
  }
  uVar2 = decl.field_2._M_local_buf[0xf];
  std::__cxx11::string::string((string *)&local_5d0);
  LayoutBindingTestResult::LayoutBindingTestResult
            (__return_storage_ptr__,(bool)(uVar2 & 1),&local_5d0,false);
  std::__cxx11::string::~string((string *)&local_5d0);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_link_errors(void)
{
	bool passed = true;

	// same sampler with different binding in two compilation units
	if (isStage(VertexShader))
	{
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(1),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam(VertexShader, "UNIFORM_DECL", decl);

		setTemplateParam(VertexShader, "OUT_ASSIGNMENT", String("fragColor ="));

		StringStream s;
		s << buildAccess(getDefaultUniformName()) << ";\n";
		setTemplateParam(VertexShader, "UNIFORM_ACCESS", s.str());
		updateTemplate(VertexShader);

		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(3),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam(FragmentShader, "UNIFORM_DECL", decl);

		s.reset();
		s << "fragColor + " << buildAccess(getDefaultUniformName()) << ";\n";
		setTemplateParam(FragmentShader, "UNIFORM_ACCESS", s.str());
		updateTemplate(FragmentShader);

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed = !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	return LayoutBindingTestResult(passed, String());
}